

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::MethodDescriptor::CopyTo(MethodDescriptor *this,MethodDescriptorProto *proto)

{
  string *psVar1;
  MethodOptions *pMVar2;
  MethodOptions *pMVar3;
  char *pcVar4;
  
  proto->_has_bits_[0] = proto->_has_bits_[0] | 1;
  psVar1 = proto->name_;
  if (psVar1 == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar1 = (string *)operator_new(0x20);
    (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
    psVar1->_M_string_length = 0;
    (psVar1->field_2)._M_local_buf[0] = '\0';
    proto->name_ = psVar1;
  }
  std::__cxx11::string::_M_assign((string *)psVar1);
  if (*(char *)(*(long *)(this + 0x18) + 0x29) == '\0') {
    *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 2;
    psVar1 = proto->input_type_;
    if (psVar1 == (string *)internal::kEmptyString_abi_cxx11_) {
      psVar1 = (string *)operator_new(0x20);
      (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
      psVar1->_M_string_length = 0;
      (psVar1->field_2)._M_local_buf[0] = '\0';
      proto->input_type_ = psVar1;
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (char *)psVar1->_M_string_length;
    }
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,0x24b007);
  }
  *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 2;
  psVar1 = proto->input_type_;
  if (psVar1 == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar1 = (string *)operator_new(0x20);
    (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
    psVar1->_M_string_length = 0;
    (psVar1->field_2)._M_local_buf[0] = '\0';
    proto->input_type_ = psVar1;
  }
  std::__cxx11::string::_M_append((char *)psVar1,**(ulong **)(*(long *)(this + 0x18) + 8));
  if (*(char *)(*(long *)(this + 0x20) + 0x29) == '\0') {
    *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 4;
    psVar1 = proto->output_type_;
    if (psVar1 == (string *)internal::kEmptyString_abi_cxx11_) {
      psVar1 = (string *)operator_new(0x20);
      (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
      psVar1->_M_string_length = 0;
      (psVar1->field_2)._M_local_buf[0] = '\0';
      proto->output_type_ = psVar1;
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (char *)psVar1->_M_string_length;
    }
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,0x24b007);
  }
  *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 4;
  psVar1 = proto->output_type_;
  if (psVar1 == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar1 = (string *)operator_new(0x20);
    (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
    psVar1->_M_string_length = 0;
    (psVar1->field_2)._M_local_buf[0] = '\0';
    proto->output_type_ = psVar1;
  }
  std::__cxx11::string::_M_append((char *)psVar1,**(ulong **)(*(long *)(this + 0x20) + 8));
  pMVar3 = *(MethodOptions **)(this + 0x28);
  pMVar2 = MethodOptions::default_instance();
  if (pMVar3 != pMVar2) {
    *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 8;
    pMVar3 = proto->options_;
    if (pMVar3 == (MethodOptions *)0x0) {
      pMVar3 = (MethodOptions *)operator_new(0x60);
      MethodOptions::MethodOptions(pMVar3);
      proto->options_ = pMVar3;
    }
    MethodOptions::CopyFrom(pMVar3,*(MethodOptions **)(this + 0x28));
    return;
  }
  return;
}

Assistant:

void MethodDescriptor::CopyTo(MethodDescriptorProto* proto) const {
  proto->set_name(name());

  if (!input_type()->is_unqualified_placeholder_) {
    proto->set_input_type(".");
  }
  proto->mutable_input_type()->append(input_type()->full_name());

  if (!output_type()->is_unqualified_placeholder_) {
    proto->set_output_type(".");
  }
  proto->mutable_output_type()->append(output_type()->full_name());

  if (&options() != &MethodOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}